

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int whereLoopAddOr(WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUnusable)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  WhereInfo *pWVar5;
  WhereClause *pWVar6;
  WhereLoop *pTemplate;
  SrcList *pSVar7;
  WhereOrInfo *pWVar8;
  WhereTerm *pWVar9;
  ulong uVar10;
  bool bVar11;
  LogEst rRun;
  LogEst nOut;
  int iVar12;
  WhereTerm *pWVar13;
  LogEst *pLVar14;
  WhereTerm *pWVar15;
  ulong uVar16;
  WhereTerm *pWVar17;
  ulong uVar18;
  ulong uVar19;
  long in_FS_OFFSET;
  undefined1 local_308 [48];
  WhereOrSet sPrev;
  WhereOrSet sCur;
  WhereOrSet local_258;
  WhereClause tempWC;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  pWVar5 = pBuilder->pWInfo;
  memset(&tempWC,0xaa,0x1e8);
  local_308._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_308._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_308._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_308._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_308._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  sCur.a[2]._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  sCur.a[1]._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  sCur.a[2].prereq = (Bitmask)&DAT_aaaaaaaaaaaaaaaa;
  sCur.a[0]._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  sCur.a[1].prereq = (Bitmask)&DAT_aaaaaaaaaaaaaaaa;
  sCur._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  sCur.a[0].prereq = (Bitmask)&DAT_aaaaaaaaaaaaaaaa;
  pWVar6 = pBuilder->pWC;
  pTemplate = pBuilder->pNew;
  pWVar15 = pWVar6->a;
  local_258.a[1].rRun = 0;
  local_258.a[1].nOut = 0;
  local_258.a[1]._12_4_ = 0;
  local_258.a[2].prereq = 0;
  local_258.a[2].rRun = 0;
  local_258.a[2].nOut = 0;
  local_258.a[2]._12_4_ = 0;
  local_258.a[0].rRun = 0;
  local_258.a[0].nOut = 0;
  local_258.a[0]._12_4_ = 0;
  local_258.a[1].prereq = 0;
  local_258._0_8_ = 0;
  local_258.a[0].prereq = 0;
  pSVar7 = pWVar5->pTabList;
  bVar1 = pTemplate->iTab;
  iVar12 = 0;
  if ((pSVar7->a[bVar1].fg.jointype & 0x10) == 0) {
    pWVar13 = pWVar15 + pWVar6->nTerm;
    iVar2 = pSVar7->a[bVar1].iCursor;
    iVar12 = 0;
    while ((pWVar15 < pWVar13 && (iVar12 == 0))) {
      iVar12 = 0;
      if (((pWVar15->eOperator & 0x200) != 0) &&
         (pWVar8 = (pWVar15->u).pOrInfo, (pWVar8->indexable & pTemplate->maskSelf) != 0)) {
        iVar3 = (pWVar8->wc).nTerm;
        pWVar9 = (pWVar8->wc).a;
        local_308._0_8_ = pBuilder->pWInfo;
        local_308._8_8_ = pBuilder->pWC;
        local_308._16_8_ = pBuilder->pNew;
        local_308._32_8_ = *(undefined8 *)&pBuilder->bldFlags1;
        local_308._24_8_ = &sCur;
        iVar12 = 0;
        bVar11 = true;
        for (pWVar17 = (pWVar8->wc).a; pWVar17 < pWVar9 + iVar3; pWVar17 = pWVar17 + 1) {
          if ((pWVar17->eOperator & 0x400) == 0) {
            if (pWVar17->leftCursor == iVar2) {
              tempWC.pWInfo = pWVar6->pWInfo;
              tempWC.op = ',';
              tempWC.nTerm = 1;
              local_308._8_8_ = &tempWC;
              tempWC.pOuter = pWVar6;
              tempWC.nBase = tempWC.nTerm;
              tempWC.a = pWVar17;
              goto LAB_0018bb64;
            }
          }
          else {
            local_308._8_8_ = pWVar17->u;
LAB_0018bb64:
            sCur._0_8_ = sCur._0_8_ & 0xffffffffffff0000;
            if ((pSVar7->a[bVar1].pSTab)->eTabType == '\x01') {
              iVar12 = whereLoopAddVirtual((WhereLoopBuilder *)local_308,mPrereq,mUnusable);
            }
            else {
              iVar12 = whereLoopAddBtree((WhereLoopBuilder *)local_308,mPrereq);
            }
            if (iVar12 == 0) {
              iVar12 = whereLoopAddOr((WhereLoopBuilder *)local_308,mPrereq,mUnusable);
            }
            uVar18 = sCur._0_8_ & 0xffff;
            if (sCur.n == 0) {
              local_258._0_8_ = local_258._0_8_ & 0xffffffffffff0000;
              break;
            }
            if (bVar11) {
              whereOrMove(&local_258,&sCur);
            }
            else {
              sPrev.a[2]._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              sPrev.a[1]._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              sPrev.a[2].prereq = (Bitmask)&DAT_aaaaaaaaaaaaaaaa;
              sPrev.a[0]._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              sPrev.a[1].prereq = (Bitmask)&DAT_aaaaaaaaaaaaaaaa;
              sPrev._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              sPrev.a[0].prereq = (Bitmask)&DAT_aaaaaaaaaaaaaaaa;
              whereOrMove(&sPrev,&local_258);
              local_258._0_8_ = local_258._0_8_ & 0xffffffffffff0000;
              for (uVar19 = 0; uVar19 < (sPrev._0_8_ & 0xffff); uVar19 = uVar19 + 1) {
                pLVar14 = &sCur.a[0].nOut;
                for (uVar16 = 0; uVar16 < uVar18; uVar16 = uVar16 + 1) {
                  uVar18 = ((WhereOrCost *)(pLVar14 + -5))->prereq;
                  uVar10 = sPrev.a[uVar19].prereq;
                  rRun = sqlite3LogEstAdd(sPrev.a[uVar19].rRun,pLVar14[-1]);
                  nOut = sqlite3LogEstAdd(sPrev.a[uVar19].nOut,*pLVar14);
                  whereOrInsert(&local_258,uVar18 | uVar10,rRun,nOut);
                  uVar18 = sCur._0_8_ & 0xffff;
                  pLVar14 = pLVar14 + 8;
                }
              }
            }
            bVar11 = false;
          }
        }
        pTemplate->nLTerm = 1;
        *pTemplate->aLTerm = pWVar15;
        pTemplate->wsFlags = 0x2000;
        pTemplate->rSetup = 0;
        pTemplate->iSortIdx = '\0';
        (pTemplate->u).btree.pOrderBy = (ExprList *)0x0;
        *(undefined8 *)&pTemplate->u = 0;
        (pTemplate->u).btree.pIndex = (Index *)0x0;
        pLVar14 = &local_258.a[0].nOut;
        for (uVar18 = 0; (iVar12 == 0 && (uVar18 < (local_258._0_8_ & 0xffff))); uVar18 = uVar18 + 1
            ) {
          pTemplate->rRun = (short)*(undefined4 *)(pLVar14 + -1) + 1;
          pTemplate->nOut = *pLVar14;
          pTemplate->prereq = ((WhereOrCost *)(pLVar14 + -5))->prereq;
          iVar12 = whereLoopInsert(pBuilder,pTemplate);
          pLVar14 = pLVar14 + 8;
        }
      }
      pWVar15 = pWVar15 + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return iVar12;
}

Assistant:

static int whereLoopAddOr(
  WhereLoopBuilder *pBuilder,
  Bitmask mPrereq,
  Bitmask mUnusable
){
  WhereInfo *pWInfo = pBuilder->pWInfo;
  WhereClause *pWC;
  WhereLoop *pNew;
  WhereTerm *pTerm, *pWCEnd;
  int rc = SQLITE_OK;
  int iCur;
  WhereClause tempWC;
  WhereLoopBuilder sSubBuild;
  WhereOrSet sSum, sCur;
  SrcItem *pItem;

  pWC = pBuilder->pWC;
  pWCEnd = pWC->a + pWC->nTerm;
  pNew = pBuilder->pNew;
  memset(&sSum, 0, sizeof(sSum));
  pItem = pWInfo->pTabList->a + pNew->iTab;
  iCur = pItem->iCursor;

  /* The multi-index OR optimization does not work for RIGHT and FULL JOIN */
  if( pItem->fg.jointype & JT_RIGHT ) return SQLITE_OK;

  for(pTerm=pWC->a; pTerm<pWCEnd && rc==SQLITE_OK; pTerm++){
    if( (pTerm->eOperator & WO_OR)!=0
     && (pTerm->u.pOrInfo->indexable & pNew->maskSelf)!=0
    ){
      WhereClause * const pOrWC = &pTerm->u.pOrInfo->wc;
      WhereTerm * const pOrWCEnd = &pOrWC->a[pOrWC->nTerm];
      WhereTerm *pOrTerm;
      int once = 1;
      int i, j;

      sSubBuild = *pBuilder;
      sSubBuild.pOrSet = &sCur;

      WHERETRACE(0x400, ("Begin processing OR-clause %p\n", pTerm));
      for(pOrTerm=pOrWC->a; pOrTerm<pOrWCEnd; pOrTerm++){
        if( (pOrTerm->eOperator & WO_AND)!=0 ){
          sSubBuild.pWC = &pOrTerm->u.pAndInfo->wc;
        }else if( pOrTerm->leftCursor==iCur ){
          tempWC.pWInfo = pWC->pWInfo;
          tempWC.pOuter = pWC;
          tempWC.op = TK_AND;
          tempWC.nTerm = 1;
          tempWC.nBase = 1;
          tempWC.a = pOrTerm;
          sSubBuild.pWC = &tempWC;
        }else{
          continue;
        }
        sCur.n = 0;
#ifdef WHERETRACE_ENABLED
        WHERETRACE(0x400, ("OR-term %d of %p has %d subterms:\n",
                   (int)(pOrTerm-pOrWC->a), pTerm, sSubBuild.pWC->nTerm));
        if( sqlite3WhereTrace & 0x20000 ){
          sqlite3WhereClausePrint(sSubBuild.pWC);
        }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
        if( IsVirtual(pItem->pSTab) ){
          rc = whereLoopAddVirtual(&sSubBuild, mPrereq, mUnusable);
        }else
#endif
        {
          rc = whereLoopAddBtree(&sSubBuild, mPrereq);
        }
        if( rc==SQLITE_OK ){
          rc = whereLoopAddOr(&sSubBuild, mPrereq, mUnusable);
        }
        testcase( rc==SQLITE_NOMEM && sCur.n>0 );
        testcase( rc==SQLITE_DONE );
        if( sCur.n==0 ){
          sSum.n = 0;
          break;
        }else if( once ){
          whereOrMove(&sSum, &sCur);
          once = 0;
        }else{
          WhereOrSet sPrev;
          whereOrMove(&sPrev, &sSum);
          sSum.n = 0;
          for(i=0; i<sPrev.n; i++){
            for(j=0; j<sCur.n; j++){
              whereOrInsert(&sSum, sPrev.a[i].prereq | sCur.a[j].prereq,
                            sqlite3LogEstAdd(sPrev.a[i].rRun, sCur.a[j].rRun),
                            sqlite3LogEstAdd(sPrev.a[i].nOut, sCur.a[j].nOut));
            }
          }
        }
      }
      pNew->nLTerm = 1;
      pNew->aLTerm[0] = pTerm;
      pNew->wsFlags = WHERE_MULTI_OR;
      pNew->rSetup = 0;
      pNew->iSortIdx = 0;
      memset(&pNew->u, 0, sizeof(pNew->u));
      for(i=0; rc==SQLITE_OK && i<sSum.n; i++){
        /* TUNING: Currently sSum.a[i].rRun is set to the sum of the costs
        ** of all sub-scans required by the OR-scan. However, due to rounding
        ** errors, it may be that the cost of the OR-scan is equal to its
        ** most expensive sub-scan. Add the smallest possible penalty
        ** (equivalent to multiplying the cost by 1.07) to ensure that
        ** this does not happen. Otherwise, for WHERE clauses such as the
        ** following where there is an index on "y":
        **
        **     WHERE likelihood(x=?, 0.99) OR y=?
        **
        ** the planner may elect to "OR" together a full-table scan and an
        ** index lookup. And other similarly odd results.  */
        pNew->rRun = sSum.a[i].rRun + 1;
        pNew->nOut = sSum.a[i].nOut;
        pNew->prereq = sSum.a[i].prereq;
        rc = whereLoopInsert(pBuilder, pNew);
      }
      WHERETRACE(0x400, ("End processing OR-clause %p\n", pTerm));
    }
  }
  return rc;
}